

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void recomputeColumnsNotIndexed(Index *pIdx)

{
  int iVar1;
  int x;
  Table *pTab;
  int j;
  Bitmask m;
  Index *pIdx_local;
  
  m = 0;
  j = (int)pIdx->nColumn;
  while (j = j - 1, -1 < j) {
    iVar1 = (int)pIdx->aiColumn[j];
    if (((-1 < iVar1) && ((pIdx->pTable->aCol[iVar1].colFlags & 0x20) == 0)) && (iVar1 < 0x3f)) {
      m = 1L << ((byte)pIdx->aiColumn[j] & 0x3f) | m;
    }
  }
  pIdx->colNotIdxed = m ^ 0xffffffffffffffff;
  return;
}

Assistant:

static void recomputeColumnsNotIndexed(Index *pIdx){
  Bitmask m = 0;
  int j;
  Table *pTab = pIdx->pTable;
  for(j=pIdx->nColumn-1; j>=0; j--){
    int x = pIdx->aiColumn[j];
    if( x>=0 && (pTab->aCol[x].colFlags & COLFLAG_VIRTUAL)==0 ){
      testcase( x==BMS-1 );
      testcase( x==BMS-2 );
      if( x<BMS-1 ) m |= MASKBIT(x);
    }
  }
  pIdx->colNotIdxed = ~m;
  assert( (pIdx->colNotIdxed>>63)==1 );  /* See note-20221022-a */
}